

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

QConfFile * __thiscall
QCache<QString,_QConfFile>::take(QCache<QString,_QConfFile> *this,QString *key)

{
  QConfFile *pQVar1;
  Node *__name;
  
  if (((this->d).size != 0) &&
     (__name = QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::findNode<QString>(&this->d,key)
     , __name != (Node *)0x0)) {
    pQVar1 = (__name->value).t;
    (__name->value).t = (QConfFile *)0x0;
    unlink(this,(char *)__name);
    return pQVar1;
  }
  return (QConfFile *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }